

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

void __thiscall
ProjectBuilderSources::ProjectBuilderSources
          (ProjectBuilderSources *this,QString *k,bool b,QString *c,bool o)

{
  long lVar1;
  bool bVar2;
  byte in_DL;
  char *in_RSI;
  QStringBuilder<QString,_const_QString_&> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]>
  *in_stack_ffffffffffffff08;
  uint7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar3;
  bool local_da;
  char *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(byte *)&(in_RDI->a).d.d = in_DL & 1;
  *(byte *)((long)&(in_RDI->a).d.d + 1) = in_R8B & 1;
  QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   (QString *)in_stack_ffffffffffffff08);
  QString::QString((QString *)0x135fa2);
  QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   (QString *)in_stack_ffffffffffffff08);
  bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                       (char **)in_stack_ffffffffffffff08);
  local_da = true;
  if (!bVar2) {
    bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         (char **)in_stack_ffffffffffffff08);
    local_da = true;
    if (!bVar2) {
      local_da = ::operator==((QString *)
                              CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                              (char **)in_stack_ffffffffffffff08);
    }
  }
  if (local_da == false) {
    bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         (char **)in_stack_ffffffffffffff08);
    if (bVar2) {
      QString::operator=(&in_RDI->a,in_RSI);
    }
    else {
      bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                           (char **)in_stack_ffffffffffffff08);
      uVar3 = true;
      if (!bVar2) {
        uVar3 = ::operator==((QString *)CONCAT17(1,in_stack_ffffffffffffff10),
                             (char **)in_stack_ffffffffffffff08);
      }
      if ((bool)uVar3 == false) {
        bVar2 = ::operator==((QString *)(ulong)in_stack_ffffffffffffff10,
                             (char **)in_stack_ffffffffffffff08);
        if (bVar2) {
          QString::operator=(&in_RDI->a,in_RSI);
        }
        else {
          bVar2 = QString::isNull((QString *)0x136161);
          if (bVar2) {
            QString::QString(&in_RDI->a,in_stack_ffffffffffffff48);
            ::operator+(&in_RDI->a,(QString *)CONCAT17(uVar3,in_stack_ffffffffffffff10));
            ::operator+(in_RDI,(char (*) [2])CONCAT17(uVar3,in_stack_ffffffffffffff10));
            ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
            QString::operator=((QString *)CONCAT17(uVar3,in_stack_ffffffffffffff10),
                               (QString *)in_stack_ffffffffffffff08);
            QString::~QString((QString *)0x1361da);
            QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]>
                             *)0x1361e4);
            QStringBuilder<QString,_const_QString_&>::~QStringBuilder
                      ((QStringBuilder<QString,_const_QString_&> *)0x1361ee);
            QString::~QString((QString *)0x1361f8);
          }
        }
      }
      else {
        QString::operator=(&in_RDI->a,in_RSI);
      }
    }
  }
  else {
    QString::operator=(&in_RDI->a,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

ProjectBuilderSources::ProjectBuilderSources(const QString &k, bool b, const QString &c, bool o) :
    buildable(b), object_output(o), key(k), compiler(c)
{
    // Override group name for a few common keys
    if (k == "SOURCES" || k == "OBJECTIVE_SOURCES" || k == "HEADERS")
        group = "Sources";
    else if (k == "QMAKE_INTERNAL_INCLUDED_FILES")
        group = "Supporting Files";
    else if (k == "GENERATED_SOURCES" || k == "GENERATED_FILES")
        group = "Generated Sources";
    else if (k == "RESOURCES")
        group = "Resources";
    else if (group.isNull())
        group = QString("Sources [") + c + "]";
}